

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

void FuzzingParameterSet::print_dynamic_parameters(int bank,bool seq_addresses,int start_row)

{
  char *args;
  string local_68;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Printing DRAM address-related fuzzing parameters:",
             (allocator<char> *)&local_68);
  Logger::log_info(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"bank_no: %d",&local_21);
  format_string<int>(&local_48,&local_68,bank);
  Logger::log_data(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"use_seq_addresses: %s",&local_21);
  args = "false";
  if (seq_addresses) {
    args = "true";
  }
  format_string<char_const*>(&local_48,&local_68,args);
  Logger::log_data(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"start_row: %d",&local_21);
  format_string<int>(&local_48,&local_68,start_row);
  Logger::log_data(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void FuzzingParameterSet::print_dynamic_parameters(const int bank, bool seq_addresses, int start_row) {
  Logger::log_info("Printing DRAM address-related fuzzing parameters:");
  Logger::log_data(format_string("bank_no: %d", bank));
  Logger::log_data(format_string("use_seq_addresses: %s", (seq_addresses ? "true" : "false")));
  Logger::log_data(format_string("start_row: %d", start_row));
}